

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

int __thiscall
cs_impl::any::
holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::kill
          (holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,__pid_t __pid,int __sig)

{
  cs::
  allocator_type<cs_impl::any::holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_64UL,_cs_impl::default_allocator_provider>
  ::free((allocator_type<cs_impl::any::holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_64UL,_cs_impl::default_allocator_provider>
          *)holder<std::__cxx11::string>::allocator,this);
  return (int)this;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}